

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int valueFromExpr(sqlite3 *db,Expr *pExpr,u8 enc,u8 affinity,sqlite3_value **ppVal,
                 ValueNewStat4Ctx *pCtx)

{
  Parse *pMem;
  u8 affinity_00;
  int iVar1;
  char *z;
  int nVal;
  u8 aff;
  char *pcStack_60;
  int rc;
  char *zNeg;
  Parse *pPStack_50;
  int negInt;
  sqlite3_value *pVal;
  char *zVal;
  ValueNewStat4Ctx *pVStack_38;
  int op;
  ValueNewStat4Ctx *pCtx_local;
  sqlite3_value **ppVal_local;
  u8 affinity_local;
  Expr *pEStack_20;
  u8 enc_local;
  Expr *pExpr_local;
  sqlite3 *db_local;
  
  pVal = (sqlite3_value *)0x0;
  pPStack_50 = (Parse *)0x0;
  zNeg._4_4_ = 1;
  pcStack_60 = "";
  nVal = 0;
  pEStack_20 = pExpr;
  while (zVal._4_4_ = (uint)pEStack_20->op, zVal._4_4_ == 0xae || zVal._4_4_ == 0xb5) {
    pEStack_20 = pEStack_20->pLeft;
  }
  if (zVal._4_4_ == 0xb0) {
    zVal._4_4_ = (uint)pEStack_20->op2;
  }
  pVStack_38 = pCtx;
  pCtx_local = (ValueNewStat4Ctx *)ppVal;
  ppVal_local._6_1_ = affinity;
  ppVal_local._7_1_ = enc;
  pExpr_local = (Expr *)db;
  if (zVal._4_4_ == 0x24) {
    affinity_00 = sqlite3AffinityType((pEStack_20->u).zToken,(Column *)0x0);
    iVar1 = valueFromExpr((sqlite3 *)pExpr_local,pEStack_20->pLeft,ppVal_local._7_1_,affinity_00,
                          (sqlite3_value **)pCtx_local,pVStack_38);
    if (pCtx_local->pParse == (Parse *)0x0) {
      return iVar1;
    }
    sqlite3VdbeMemCast((Mem *)pCtx_local->pParse,affinity_00,ppVal_local._7_1_);
    sqlite3ValueApplyAffinity
              ((sqlite3_value *)pCtx_local->pParse,ppVal_local._6_1_,ppVal_local._7_1_);
    return iVar1;
  }
  if ((zVal._4_4_ == 0xad) && ((pEStack_20->pLeft->op == 0x9b || (pEStack_20->pLeft->op == 0x99))))
  {
    pEStack_20 = pEStack_20->pLeft;
    zVal._4_4_ = (uint)pEStack_20->op;
    zNeg._4_4_ = -1;
    pcStack_60 = "-";
  }
  if (((zVal._4_4_ == 0x75) || (zVal._4_4_ == 0x99)) || (zVal._4_4_ == 0x9b)) {
    pPStack_50 = (Parse *)valueNew(db,pCtx);
    if (pPStack_50 == (Parse *)0x0) {
LAB_00178a83:
      sqlite3OomFault((sqlite3 *)pExpr_local);
      sqlite3DbFree((sqlite3 *)pExpr_local,pVal);
      sqlite3ValueFree((sqlite3_value *)pPStack_50);
      return 7;
    }
    if ((pEStack_20->flags & 0x800) == 0) {
      pVal = (sqlite3_value *)
             sqlite3MPrintf((sqlite3 *)pExpr_local,"%s%s",pcStack_60,(pEStack_20->u).zToken);
      if (pVal == (sqlite3_value *)0x0) {
        pVal = (sqlite3_value *)0x0;
        goto LAB_00178a83;
      }
      sqlite3ValueSetStr((sqlite3_value *)pPStack_50,-1,pVal,'\x01',sqlite3OomClear);
    }
    else {
      sqlite3VdbeMemSetInt64((Mem *)pPStack_50,(long)(pEStack_20->u).iValue * (long)zNeg._4_4_);
    }
    if (((zVal._4_4_ == 0x9b) || (zVal._4_4_ == 0x99)) && (ppVal_local._6_1_ == 'A')) {
      sqlite3ValueApplyAffinity((sqlite3_value *)pPStack_50,'C','\x01');
    }
    else {
      sqlite3ValueApplyAffinity((sqlite3_value *)pPStack_50,ppVal_local._6_1_,'\x01');
    }
    if (((ulong)pPStack_50->pVdbe & 0x2c00000000) != 0) {
      *(u16 *)((long)&pPStack_50->pVdbe + 4) = *(u16 *)((long)&pPStack_50->pVdbe + 4) & 0xfffd;
    }
    if (ppVal_local._7_1_ != 1) {
      nVal = sqlite3VdbeChangeEncoding((Mem *)pPStack_50,(uint)ppVal_local._7_1_);
    }
  }
  else if (zVal._4_4_ == 0xad) {
    iVar1 = valueFromExpr(db,pEStack_20->pLeft,enc,affinity,
                          (sqlite3_value **)&stack0xffffffffffffffb0,pCtx);
    if ((iVar1 == 0) && (pPStack_50 != (Parse *)0x0)) {
      sqlite3VdbeMemNumerify((Mem *)pPStack_50);
      if (((ulong)pPStack_50->pVdbe & 0x800000000) == 0) {
        if (((MemValue *)&pPStack_50->db)->i == -0x8000000000000000) {
          ((MemValue *)&pPStack_50->db)->zPType = (char *)0x43e0000000000000;
          *(u16 *)((long)&pPStack_50->pVdbe + 4) =
               *(u16 *)((long)&pPStack_50->pVdbe + 4) & 0xf240 | 8;
        }
        else {
          ((MemValue *)&pPStack_50->db)->i = -((MemValue *)&pPStack_50->db)->i;
        }
      }
      else {
        ((MemValue *)&pPStack_50->db)->i = ((MemValue *)&pPStack_50->db)->i ^ 0x8000000000000000;
      }
      sqlite3ValueApplyAffinity((sqlite3_value *)pPStack_50,ppVal_local._6_1_,ppVal_local._7_1_);
    }
  }
  else if (zVal._4_4_ == 0x79) {
    pPStack_50 = (Parse *)valueNew(db,pCtx);
    if (pPStack_50 == (Parse *)0x0) {
      pPStack_50 = (Parse *)0x0;
      goto LAB_00178a83;
    }
    sqlite3VdbeMemSetNull((Mem *)pPStack_50);
  }
  else if (zVal._4_4_ == 0x9a) {
    pPStack_50 = (Parse *)valueNew(db,pCtx);
    if (pPStack_50 == (Parse *)0x0) {
      pPStack_50 = (Parse *)0x0;
      goto LAB_00178a83;
    }
    pVal = (sqlite3_value *)((pEStack_20->u).zToken + 2);
    iVar1 = sqlite3Strlen30((char *)pVal);
    pMem = pPStack_50;
    z = (char *)sqlite3HexToBlob((sqlite3 *)pExpr_local,(char *)pVal,iVar1 + -1);
    sqlite3VdbeMemSetStr((Mem *)pMem,z,(long)((iVar1 + -1) / 2),'\0',sqlite3OomClear);
  }
  else if ((zVal._4_4_ == 0xaa) &&
          (pPStack_50 = (Parse *)valueNew(db,pCtx), pPStack_50 != (Parse *)0x0)) {
    *(u16 *)((long)&pPStack_50->pVdbe + 4) = 4;
    *(long *)&pPStack_50->db = (long)(int)(uint)((pEStack_20->u).zToken[4] == '\0');
  }
  pCtx_local->pParse = pPStack_50;
  return nVal;
}

Assistant:

static int valueFromExpr(
  sqlite3 *db,                    /* The database connection */
  const Expr *pExpr,              /* The expression to evaluate */
  u8 enc,                         /* Encoding to use */
  u8 affinity,                    /* Affinity to use */
  sqlite3_value **ppVal,          /* Write the new value here */
  struct ValueNewStat4Ctx *pCtx   /* Second argument for valueNew() */
){
  int op;
  char *zVal = 0;
  sqlite3_value *pVal = 0;
  int negInt = 1;
  const char *zNeg = "";
  int rc = SQLITE_OK;

  assert( pExpr!=0 );
  while( (op = pExpr->op)==TK_UPLUS || op==TK_SPAN ) pExpr = pExpr->pLeft;
  if( op==TK_REGISTER ) op = pExpr->op2;

  /* Compressed expressions only appear when parsing the DEFAULT clause
  ** on a table column definition, and hence only when pCtx==0.  This
  ** check ensures that an EP_TokenOnly expression is never passed down
  ** into valueFromFunction(). */
  assert( (pExpr->flags & EP_TokenOnly)==0 || pCtx==0 );

  if( op==TK_CAST ){
    u8 aff;
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    aff = sqlite3AffinityType(pExpr->u.zToken,0);
    rc = valueFromExpr(db, pExpr->pLeft, enc, aff, ppVal, pCtx);
    testcase( rc!=SQLITE_OK );
    if( *ppVal ){
      sqlite3VdbeMemCast(*ppVal, aff, enc);
      sqlite3ValueApplyAffinity(*ppVal, affinity, enc);
    }
    return rc;
  }

  /* Handle negative integers in a single step.  This is needed in the
  ** case when the value is -9223372036854775808.
  */
  if( op==TK_UMINUS
   && (pExpr->pLeft->op==TK_INTEGER || pExpr->pLeft->op==TK_FLOAT) ){
    pExpr = pExpr->pLeft;
    op = pExpr->op;
    negInt = -1;
    zNeg = "-";
  }

  if( op==TK_STRING || op==TK_FLOAT || op==TK_INTEGER ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    if( ExprHasProperty(pExpr, EP_IntValue) ){
      sqlite3VdbeMemSetInt64(pVal, (i64)pExpr->u.iValue*negInt);
    }else{
      zVal = sqlite3MPrintf(db, "%s%s", zNeg, pExpr->u.zToken);
      if( zVal==0 ) goto no_mem;
      sqlite3ValueSetStr(pVal, -1, zVal, SQLITE_UTF8, SQLITE_DYNAMIC);
    }
    if( (op==TK_INTEGER || op==TK_FLOAT ) && affinity==SQLITE_AFF_BLOB ){
      sqlite3ValueApplyAffinity(pVal, SQLITE_AFF_NUMERIC, SQLITE_UTF8);
    }else{
      sqlite3ValueApplyAffinity(pVal, affinity, SQLITE_UTF8);
    }
    assert( (pVal->flags & MEM_IntReal)==0 );
    if( pVal->flags & (MEM_Int|MEM_IntReal|MEM_Real) ){
      testcase( pVal->flags & MEM_Int );
      testcase( pVal->flags & MEM_Real );
      pVal->flags &= ~MEM_Str;
    }
    if( enc!=SQLITE_UTF8 ){
      rc = sqlite3VdbeChangeEncoding(pVal, enc);
    }
  }else if( op==TK_UMINUS ) {
    /* This branch happens for multiple negative signs.  Ex: -(-5) */
    if( SQLITE_OK==valueFromExpr(db,pExpr->pLeft,enc,affinity,&pVal,pCtx)
     && pVal!=0
    ){
      sqlite3VdbeMemNumerify(pVal);
      if( pVal->flags & MEM_Real ){
        pVal->u.r = -pVal->u.r;
      }else if( pVal->u.i==SMALLEST_INT64 ){
#ifndef SQLITE_OMIT_FLOATING_POINT
        pVal->u.r = -(double)SMALLEST_INT64;
#else
        pVal->u.r = LARGEST_INT64;
#endif
        MemSetTypeFlag(pVal, MEM_Real);
      }else{
        pVal->u.i = -pVal->u.i;
      }
      sqlite3ValueApplyAffinity(pVal, affinity, enc);
    }
  }else if( op==TK_NULL ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    sqlite3VdbeMemSetNull(pVal);
  }
#ifndef SQLITE_OMIT_BLOB_LITERAL
  else if( op==TK_BLOB ){
    int nVal;
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
    assert( pExpr->u.zToken[1]=='\'' );
    pVal = valueNew(db, pCtx);
    if( !pVal ) goto no_mem;
    zVal = &pExpr->u.zToken[2];
    nVal = sqlite3Strlen30(zVal)-1;
    assert( zVal[nVal]=='\'' );
    sqlite3VdbeMemSetStr(pVal, sqlite3HexToBlob(db, zVal, nVal), nVal/2,
                         0, SQLITE_DYNAMIC);
  }
#endif
#ifdef SQLITE_ENABLE_STAT4
  else if( op==TK_FUNCTION && pCtx!=0 ){
    rc = valueFromFunction(db, pExpr, enc, affinity, &pVal, pCtx);
  }
#endif
  else if( op==TK_TRUEFALSE ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    pVal = valueNew(db, pCtx);
    if( pVal ){
      pVal->flags = MEM_Int;
      pVal->u.i = pExpr->u.zToken[4]==0;
    }
  }

  *ppVal = pVal;
  return rc;

no_mem:
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx==0 || NEVER(pCtx->pParse->nErr==0) )
#endif
    sqlite3OomFault(db);
  sqlite3DbFree(db, zVal);
  assert( *ppVal==0 );
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx==0 ) sqlite3ValueFree(pVal);
#else
  assert( pCtx==0 ); sqlite3ValueFree(pVal);
#endif
  return SQLITE_NOMEM_BKPT;
}